

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int __thiscall CVmRun::compute_quotient(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  int iVar1;
  int iVar2;
  CVmObject *pCVar3;
  vm_val_t *in_RDX;
  int *in_RSI;
  undefined4 in_stack_ffffffffffffffd8;
  
  while( true ) {
    iVar1 = *in_RSI;
    if (iVar1 == 5) {
      pCVar3 = vm_objp(0);
      iVar1 = (*pCVar3->_vptr_CVmObject[0x25])(pCVar3,in_RSI,(ulong)(uint)in_RSI[2],in_RDX);
      return iVar1;
    }
    if (iVar1 != 7) break;
    iVar2 = vm_val_t::is_numeric(in_RDX);
    if (iVar2 == 0) {
      err_throw(0);
    }
    vm_val_t::promote_int(in_RDX,(vm_val_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  }
  return 0;
}

Assistant:

int CVmRun::compute_quotient(VMG_ vm_val_t *val1, vm_val_t *val2)
{
check_type:
    switch(val1->typ)
    {
    case VM_OBJ:
        /* use the object's virtual division method */
        return vm_objp(vmg_ val1->val.obj)->div_val(
            vmg_ val1, val1->val.obj, val2);
        break;

    case VM_INT:
        /* callers handle int/int inline; check for other numeric types */
        if (val2->is_numeric(vmg0_))
        {
            /* promote to integer, then restart with the promoted value */
            val2->promote_int(vmg_ val1);
            goto check_type;
        }
        else
        {
            err_throw(VMERR_NUM_VAL_REQD);
            AFTER_ERR_THROW(return FALSE;)
        }

    default:
        /* other types are invalid */
        return FALSE;
    }
}